

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTable
          (BinaryReaderIR *this,Index index,Type elem_type,Limits *elem_limits)

{
  undefined2 uVar1;
  Module *this_00;
  pointer pTVar2;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_68;
  Table *local_60;
  Table *table;
  undefined1 local_38 [8];
  __single_object field;
  Limits *elem_limits_local;
  Index index_local;
  BinaryReaderIR *this_local;
  Type elem_type_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>.
  super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>,_true,_true>
          )elem_limits;
  GetLocation((Location *)&table,this);
  std::make_unique<wabt::TableModuleField,wabt::Location>((Location *)local_38);
  pTVar2 = std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
           operator->((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                       *)local_38);
  local_60 = &pTVar2->table;
  (pTVar2->table).elem_limits.initial =
       *(uint64_t *)
        field._M_t.
        super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>.
        _M_t.
        super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
        .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl;
  (pTVar2->table).elem_limits.max =
       *(uint64_t *)
        ((long)field._M_t.
               super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
               .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 8);
  uVar1 = *(undefined2 *)
           ((long)field._M_t.
                  super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                  .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x10);
  (pTVar2->table).elem_limits.has_max = (bool)(char)uVar1;
  (pTVar2->table).elem_limits.is_shared = (bool)(char)((ushort)uVar1 >> 8);
  (pTVar2->table).elem_limits.is_64 =
       *(bool *)((long)field._M_t.
                       super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                       .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x12);
  (pTVar2->table).elem_type = elem_type;
  this_00 = this->module_;
  std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::unique_ptr
            (&local_68,
             (unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> *)
             local_38);
  Module::AppendField(this_00,&local_68);
  std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::~unique_ptr
            (&local_68);
  Result::Result((Result *)&elem_type_local,Ok);
  std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::~unique_ptr
            ((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> *)
             local_38);
  return (Result)elem_type_local.enum_;
}

Assistant:

Result BinaryReaderIR::OnTable(Index index,
                               Type elem_type,
                               const Limits* elem_limits) {
  auto field = std::make_unique<TableModuleField>(GetLocation());
  Table& table = field->table;
  table.elem_limits = *elem_limits;
  table.elem_type = elem_type;
  module_->AppendField(std::move(field));
  return Result::Ok;
}